

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection_yolo.cpp
# Opt level: O1

void drawPred(int classId,float conf,int left,int top,int right,int bottom,Mat *frame)

{
  pointer pcVar1;
  long *plVar2;
  undefined8 uVar3;
  long *plVar4;
  int baseLine;
  Size labelSize;
  string label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int local_f4;
  int local_f0;
  int local_ec;
  long *local_e8;
  Mat *pMStack_e0;
  long lStack_d8;
  long lStack_d0;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  Mat *local_98;
  undefined8 auStack_90 [2];
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lStack_d8 = 0;
  local_e8 = (long *)CONCAT44(local_e8._4_4_,0x3010000);
  local_c8 = (undefined8 *)0x406fe00000000000;
  uStack_c0 = 0x4066400000000000;
  local_b8 = 0x4049000000000000;
  uStack_b0 = 0;
  pMStack_e0 = frame;
  local_68 = right;
  local_64 = bottom;
  local_60 = left;
  local_5c = top;
  cv::rectangle();
  cv::format_abi_cxx11_((char *)&local_c8,SUB84((double)conf,0),"%.2f");
  if (classes_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      classes_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((int)((ulong)((long)classes_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)classes_abi_cxx11_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) <= classId) {
      local_e8 = &lStack_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"classId < (int)classes.size()","");
      uVar3 = cv::error(-0xd7,(string *)&local_e8,"drawPred",
                        "/workspace/llm4binary/github/license_c_cmakelists/madhu-korada[P]YOLO-IOU-cpp/object_detection_yolo.cpp"
                        ,0x1bc);
      if (local_e8 != &lStack_d8) {
        operator_delete(local_e8);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      _Unwind_Resume(uVar3);
    }
    pcVar1 = classes_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[classId]._M_dataplus._M_p;
    local_a0 = auStack_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar1,
               pcVar1 + classes_abi_cxx11_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[classId]._M_string_length);
    std::__cxx11::string::append((char *)&local_a0);
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c8);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      lStack_d8 = *plVar4;
      lStack_d0 = plVar2[3];
      local_e8 = &lStack_d8;
    }
    else {
      lStack_d8 = *plVar4;
      local_e8 = (long *)*plVar2;
    }
    pMStack_e0 = (Mat *)plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_e8);
    if (local_e8 != &lStack_d8) {
      operator_delete(local_e8);
    }
    if (local_a0 != auStack_90) {
      operator_delete(local_a0);
    }
  }
  cv::getTextSize((string *)&local_f0,(int)&local_c8,0.5,0,(int *)0x1);
  if (top < local_ec) {
    top = local_ec;
  }
  auStack_90[0] = 0;
  local_a0 = (undefined8 *)CONCAT44(local_a0._4_4_,0x3010000);
  local_6c = top - local_ec;
  local_78 = local_f0 + left;
  local_74 = local_f4 + top;
  local_e8 = (long *)0x406fe00000000000;
  pMStack_e0 = (Mat *)0x406fe00000000000;
  lStack_d8 = 0x406fe00000000000;
  lStack_d0 = 0;
  local_98 = frame;
  local_70 = left;
  cv::rectangle();
  lStack_d8 = 0;
  local_e8 = (long *)CONCAT44(local_e8._4_4_,0x3010000);
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  pMStack_e0 = frame;
  local_80 = left;
  local_7c = top;
  cv::putText(0,&local_e8,&local_c8,&local_80,0,&local_58,1,8,0);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  return;
}

Assistant:

void drawPred(int classId, float conf, int left, int top, int right, int bottom, cv::Mat& frame)
{
    //Draw a rectangle displaying the bounding box
    cv::rectangle(frame, cv::Point(left, top), cv::Point(right, bottom), cv::Scalar(255, 178, 50), 3);
    
    //Get the label for the class name and its confidence
    std::string label = cv::format("%.2f", conf);
    if (!classes.empty())
    {
        CV_Assert(classId < (int)classes.size());
        label = classes[classId] + ":" + label;
    }
    
    //Display the label at the top of the bounding box
    int baseLine;
    cv::Size labelSize = cv::getTextSize(label, cv::FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);
    top = cv::max(top, labelSize.height);
    cv::rectangle(frame, cv::Point(left, top - round(1*labelSize.height)), cv::Point(left + round(1*labelSize.width), top + baseLine), cv::Scalar(255, 255, 255), cv::FILLED);
    cv::putText(frame, label, cv::Point(left, top), cv::FONT_HERSHEY_SIMPLEX, 0.5, cv::Scalar(0,0,0),1);
}